

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniSSC.cpp
# Opt level: O3

void * MiniSSCThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  SOCKET SVar10;
  long lVar11;
  char *pcVar12;
  double dVar13;
  int selectedchannels [5];
  int pws [5];
  CHRONO chrono_period;
  MINISSC minissc;
  char szTemp [256];
  char szSaveFilePath [256];
  timespec local_8e8;
  undefined4 local_8d8;
  int local_8cc;
  int local_8c8 [7];
  int local_8ac;
  timespec local_8a8;
  long local_898;
  long lStack_890;
  long local_888;
  long lStack_880;
  timespec local_878;
  int local_868;
  double local_860;
  double local_858;
  MINISSC local_850;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_850,0,0x618);
  iVar4 = clock_getres(4,&local_878);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_8a8), iVar4 == 0)) {
    local_868 = 0;
    local_898 = 0;
    lStack_890 = 0;
    local_888 = 0;
    lStack_880 = 0;
  }
  iVar4 = 0x32;
  bVar2 = false;
  local_8cc = 0;
  do {
    iVar8 = iVar4 / 1000;
    iVar5 = iVar4 % 1000;
    bVar2 = !bVar2;
    local_8ac = iVar4;
    while( true ) {
      if (local_868 == 0) {
        clock_gettime(4,&local_8e8);
        local_898 = local_8e8.tv_sec;
        lStack_890 = local_8e8.tv_nsec;
        local_8e8.tv_sec =
             ((local_8e8.tv_sec + local_888) - local_8a8.tv_sec) +
             (local_8e8.tv_nsec + lStack_880) / 1000000000;
        local_8e8.tv_nsec = (local_8e8.tv_nsec + lStack_880) % 1000000000 - local_8a8.tv_nsec;
        if (local_8e8.tv_nsec < 0) {
          local_8e8.tv_sec = local_8e8.tv_sec + ~((ulong)-local_8e8.tv_nsec / 1000000000);
          local_8e8.tv_nsec =
               local_8e8.tv_nsec + 1000000000 +
               ((ulong)-local_8e8.tv_nsec / 1000000000) * 1000000000;
        }
        local_888 = local_8e8.tv_sec;
        lStack_880 = local_8e8.tv_nsec;
      }
      iVar4 = clock_getres(4,&local_878);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_8a8), iVar4 == 0)) {
        local_868 = 0;
        local_888 = 0;
        lStack_880 = 0;
        local_898 = 0;
        lStack_890 = 0;
      }
      local_8e8.tv_sec = (long)iVar8;
      local_8e8.tv_nsec = (long)(iVar5 * 1000000);
      nanosleep(&local_8e8,(timespec *)0x0);
      iVar4 = local_8ac;
      if (bPauseMiniSSC == 0) break;
      if (!bVar2) {
        puts("MiniSSC paused.");
        SVar10 = local_850.RS232Port.s;
        switch(local_850.RS232Port.DevType) {
        case 0:
          iVar4 = (int)local_850.RS232Port.hDev;
          goto LAB_001bf8f6;
        case 1:
        case 3:
          iVar4 = local_850.RS232Port.s;
          break;
        case 2:
          shutdown(local_850.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar4 = local_850.RS232Port.s_srv;
          break;
        default:
          goto switchD_001bf8b8_default;
        }
        shutdown(iVar4,2);
LAB_001bf8f6:
        iVar4 = close(iVar4);
        pcVar12 = "MiniSSC disconnected.";
        if (iVar4 != 0) {
switchD_001bf8b8_default:
          pcVar12 = "MiniSSC disconnection failed.";
        }
        puts(pcVar12);
      }
      if (bExit != 0) goto LAB_001bfd7d;
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 100000000;
      nanosleep(&local_8e8,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartMiniSSC == 0) {
      if (bVar2) goto LAB_001bfb74;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_860 = u1 * 1000.0;
      local_858 = u2 * 1000.0;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 0;
      bVar3 = false;
      local_8c8[0] = 0;
      local_8c8[1] = 0;
      local_8c8[2] = 0;
      local_8c8[3] = 0;
      local_8c8[4] = 0;
      lVar11 = (long)local_850.rightthrusterchan;
      dVar13 = local_858 * 0.5;
      local_8c8[lVar11] = (int)(local_860 * 0.5) + 0x5dc;
      lVar7 = (long)local_850.leftthrusterchan;
      local_8c8[lVar7] = (int)dVar13 + 0x5dc;
      iVar8 = local_8c8[lVar11];
      if (1999 < iVar8) {
        iVar8 = 2000;
      }
      if (iVar8 < 0x3e9) {
        iVar8 = 1000;
      }
      local_8c8[lVar11] = iVar8;
      iVar8 = local_8c8[lVar7];
      if (1999 < local_8c8[lVar7]) {
        iVar8 = 2000;
      }
      local_8d8 = 0;
      if (iVar8 < 0x3e9) {
        iVar8 = 1000;
      }
      local_8c8[lVar7] = iVar8;
      bVar2 = true;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar11 * 4) = 1;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar7 * 4) = 1;
      iVar8 = SetAllPWMsMiniSSC(&local_850,(int *)&local_8e8,local_8c8);
      if (iVar8 != 0) {
        puts("Connection to a MiniSSC lost.");
        SVar10 = local_850.RS232Port.s;
        iVar8 = local_8cc;
        switch(local_850.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_850.RS232Port.hDev;
          goto LAB_001bfd42;
        case 1:
        case 3:
          iVar5 = local_850.RS232Port.s;
          break;
        case 2:
          shutdown(local_850.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar5 = local_850.RS232Port.s_srv;
          break;
        default:
          goto switchD_001bfb07_default;
        }
        shutdown(iVar5,2);
LAB_001bfd42:
        iVar5 = close(iVar5);
        pcVar12 = "MiniSSC disconnected.";
        if (iVar5 != 0) {
switchD_001bfb07_default:
          pcVar12 = "MiniSSC disconnection failed.";
        }
        puts(pcVar12);
        goto LAB_001bfbab;
      }
    }
    else {
      if (!bVar2) {
        puts("Restarting a MiniSSC.");
        SVar10 = local_850.RS232Port.s;
        switch(local_850.RS232Port.DevType) {
        case 0:
          iVar8 = (int)local_850.RS232Port.hDev;
          goto LAB_001bfb48;
        case 1:
        case 3:
          iVar8 = local_850.RS232Port.s;
          break;
        case 2:
          shutdown(local_850.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar8 = local_850.RS232Port.s_srv;
          break;
        default:
          goto switchD_001bf99f_default;
        }
        shutdown(iVar8,2);
LAB_001bfb48:
        iVar8 = close(iVar8);
        pcVar12 = "MiniSSC disconnected.";
        if (iVar8 != 0) {
switchD_001bf99f_default:
          pcVar12 = "MiniSSC disconnection failed.";
        }
        puts(pcVar12);
      }
      bRestartMiniSSC = 0;
LAB_001bfb74:
      iVar5 = ConnectMiniSSC(&local_850,"MiniSSC0.txt");
      iVar8 = local_850.threadperiod;
      if (iVar5 == 0) {
        if ((FILE *)local_850.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)local_850.pfSaveFile);
          local_850.pfSaveFile = (FILE *)0x0;
        }
        bVar2 = true;
        iVar4 = iVar8;
        if (local_850.bSaveRawData == 0) {
          bVar3 = false;
        }
        else {
          if (local_850.szCfgFilePath[0] == '\0') {
            builtin_strncpy(local_238,"minissc",8);
          }
          else {
            sprintf(local_238,"%.127s",local_850.szCfgFilePath);
          }
          sVar6 = strlen(local_238);
          iVar8 = (int)sVar6 + 1;
          uVar9 = sVar6 & 0xffffffff;
          do {
            if ((int)uVar9 < 1) goto LAB_001bfc91;
            uVar1 = uVar9 - 1;
            iVar8 = iVar8 + -1;
            lVar7 = uVar9 + 0x3f;
            uVar9 = uVar1;
          } while (*(char *)((long)local_850.bProportionalPWs + lVar7) != '.');
          if ((uVar1 != 0) && (iVar8 <= (int)sVar6)) {
            memset(local_238 + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
          }
LAB_001bfc91:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar12 = strtimeex_fns();
          bVar3 = false;
          sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar12);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          local_850.pfSaveFile = (FILE *)fopen(local_138,"wb");
          if ((FILE *)local_850.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create MiniSSC data file.");
            bVar3 = false;
            break;
          }
        }
      }
      else {
        local_8e8.tv_sec = 1;
        local_8e8.tv_nsec = 0;
        nanosleep(&local_8e8,(timespec *)0x0);
        iVar8 = local_8cc;
LAB_001bfbab:
        if (ExitOnErrorCount <= iVar8 + 1 && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_001bfd7d:
          bVar3 = true;
          break;
        }
        bVar2 = false;
        bVar3 = true;
        local_8cc = iVar8 + 1;
      }
    }
  } while (bExit == 0);
  local_8e8.tv_sec = 0;
  local_8e8.tv_nsec = 0;
  local_8c8[0] = 0;
  local_8c8[1] = 0;
  local_8c8[2] = 0;
  local_8c8[3] = 0;
  local_8c8[4] = 0;
  lVar7 = (long)local_850.rightthrusterchan;
  local_8c8[lVar7] = 0x5dc;
  lVar11 = (long)local_850.leftthrusterchan;
  local_8c8[lVar11] = 0x5dc;
  iVar4 = local_8c8[lVar7];
  if (1999 < iVar4) {
    iVar4 = 2000;
  }
  if (iVar4 < 0x3e9) {
    iVar4 = 1000;
  }
  local_8c8[lVar7] = iVar4;
  iVar4 = 2000;
  if (local_8c8[lVar11] < 2000) {
    iVar4 = local_8c8[lVar11];
  }
  local_8d8 = 0;
  if (iVar4 < 0x3e9) {
    iVar4 = 1000;
  }
  local_8c8[lVar11] = iVar4;
  *(undefined4 *)((long)&local_8e8.tv_sec + lVar7 * 4) = 1;
  *(undefined4 *)((long)&local_8e8.tv_sec + lVar11 * 4) = 1;
  SetAllPWMsMiniSSC(&local_850,(int *)&local_8e8,local_8c8);
  local_8e8.tv_sec = 0;
  local_8e8.tv_nsec = 50000000;
  nanosleep(&local_8e8,(timespec *)0x0);
  if (local_868 == 0) {
    clock_gettime(4,&local_8e8);
    local_898 = local_8e8.tv_sec;
    lStack_890 = local_8e8.tv_nsec;
    local_8e8.tv_sec =
         ((local_8e8.tv_sec + local_888) - local_8a8.tv_sec) +
         (local_8e8.tv_nsec + lStack_880) / 1000000000;
    local_8e8.tv_nsec = (local_8e8.tv_nsec + lStack_880) % 1000000000 - local_8a8.tv_nsec;
    if (local_8e8.tv_nsec < 0) {
      local_8e8.tv_sec = local_8e8.tv_sec + ~((ulong)-local_8e8.tv_nsec / 1000000000);
      local_8e8.tv_nsec =
           local_8e8.tv_nsec + 1000000000 + ((ulong)-local_8e8.tv_nsec / 1000000000) * 1000000000;
    }
    local_888 = local_8e8.tv_sec;
    lStack_880 = local_8e8.tv_nsec;
  }
  if ((FILE *)local_850.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_850.pfSaveFile);
    local_850.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001bff8f;
  switch(local_850.RS232Port.DevType) {
  case 0:
    goto LAB_001bff6f;
  case 1:
  case 3:
    SVar10 = local_850.RS232Port.s;
    break;
  case 2:
    shutdown(local_850.RS232Port.s,2);
    close(local_850.RS232Port.s);
  case 4:
    SVar10 = local_850.RS232Port.s_srv;
    break;
  default:
    goto switchD_001bff37_default;
  }
  shutdown(SVar10,2);
  local_850.RS232Port.hDev._0_4_ = SVar10;
LAB_001bff6f:
  iVar4 = close((int)local_850.RS232Port.hDev);
  if (iVar4 == 0) {
    pcVar12 = "MiniSSC disconnected.";
  }
  else {
switchD_001bff37_default:
    pcVar12 = "MiniSSC disconnection failed.";
  }
  puts(pcVar12);
LAB_001bff8f:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MiniSSCThread(void* pParam)
{
	MINISSC minissc;
	//double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&minissc, 0, sizeof(MINISSC));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMiniSSC) 
		{
			if (bConnected)
			{
				printf("MiniSSC paused.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMiniSSC) 
		{
			if (bConnected)
			{
				printf("Restarting a MiniSSC.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			bRestartMiniSSC = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMiniSSC(&minissc, "MiniSSC0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = minissc.threadperiod;

				if (minissc.pfSaveFile != NULL)
				{
					fclose(minissc.pfSaveFile); 
					minissc.pfSaveFile = NULL;
				}
				if ((minissc.bSaveRawData)&&(minissc.pfSaveFile == NULL)) 
				{
					if (strlen(minissc.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", minissc.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "minissc");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					minissc.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (minissc.pfSaveFile == NULL) 
					{
						printf("Unable to create MiniSSC data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUBBLE_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersMiniSSC(&minissc, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a MiniSSC lost.\n");
					bConnected = FALSE;
					DisconnectMiniSSC(&minissc);
					break;
				}
				break;
			}
		}

		//printf("MiniSSCThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	default:
		SetThrustersMiniSSC(&minissc, 0, 0);
		mSleep(50);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (minissc.pfSaveFile != NULL)
	{
		fclose(minissc.pfSaveFile); 
		minissc.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMiniSSC(&minissc);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}